

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

ssize_t __thiscall B000FFReadWriter::write(B000FFReadWriter *this,int __fd,void *__buf,size_t __n)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  _Rb_tree_node_base *p_Var4;
  element_type *peVar5;
  ssize_t in_RAX;
  _Base_ptr p_Var6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  uint32_t size;
  undefined4 in_register_00000034;
  ulong uVar11;
  int iVar12;
  void *pvVar13;
  
  if (__buf != (void *)0x0) {
    p_Var1 = &(this->_blockmap)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var6 = (this->_curblk)._M_node;
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
LAB_00119803:
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar10 = "b000ff: out of space";
LAB_00119827:
        *puVar7 = pcVar10;
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      if ((uint)(*(int *)((long)&p_Var6[1]._M_left + 4) + *(int *)&p_Var6[1]._M_left) <= this->_bpos
         ) {
        (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this);
        if ((_Rb_tree_header *)(this->_curblk)._M_node == p_Var1) goto LAB_00119803;
      }
      p_Var6 = (this->_curblk)._M_node;
      uVar2 = *(uint *)&p_Var6[1]._M_left;
      if (this->_bpos < uVar2) {
        if (1 < g_verbose) {
          printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n",(ulong)this->_bpos,
                 (ulong)uVar2,
                 (ulong)(uint)(*(int *)((long)&p_Var6[1]._M_left + 4) + *(int *)&p_Var6[1]._M_left))
          ;
        }
        p_Var4 = (this->_curblk)._M_node;
        if (p_Var4 == (this->_blockmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          pcVar10 = "b000ff: can\'t write before first block";
          goto LAB_00119827;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_decrement(p_Var4);
        (this->_curblk)._M_node = p_Var6;
        iVar12 = *(int *)((long)&p_Var6[1]._M_left + 4) + *(int *)&p_Var6[1]._M_left;
        uVar3 = this->_blocksize;
        uVar8 = this->_bpos - iVar12;
        iVar9 = uVar8 - uVar8 % uVar3;
        size = (uVar2 - iVar12) + iVar9;
        if (uVar3 <= size) {
          size = uVar3;
        }
        allocblock(this,iVar9 + iVar12,size);
        (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,(ulong)this->_bpos);
      }
      p_Var6 = (this->_curblk)._M_node;
      *(undefined1 *)&p_Var6[1]._M_right = 1;
      uVar11 = (ulong)(this->_bpos - *(int *)&p_Var6[1]._M_left);
      pvVar13 = (void *)(*(uint *)((long)&p_Var6[1]._M_left + 4) - uVar11);
      if (__buf <= pvVar13) {
        pvVar13 = __buf;
      }
      peVar5 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_ReadWriter[4])(peVar5,(long)&(p_Var6[1]._M_parent)->_M_color + uVar11);
      peVar5 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar9 = (*peVar5->_vptr_ReadWriter[3])(peVar5,CONCAT44(in_register_00000034,__fd),pvVar13);
      in_RAX = CONCAT44(extraout_var,iVar9);
      this->_bpos = this->_bpos + (int)pvVar13;
      __buf = (void *)((long)__buf - (long)pvVar13);
    } while (__buf != (void *)0x0);
  }
  return in_RAX;
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        while (n) {
            if (_curblk==_blockmap.end())
                throw "b000ff: out of space";

            // cur pos is after cur block -> move to next
            if (_bpos >= _curblk->second.endblkofs()) {
                setpos(_bpos);

                if (_curblk==_blockmap.end())
                    throw "b000ff: out of space";
            }

            // cur pos is before current block ( and after prev block )
            if (_bpos < _curblk->second.blockofs) {
                uint32_t nextstart= _curblk->second.blockofs;

                if (g_verbose>1)
                    printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n", _bpos, nextstart, _curblk->second.endblkofs());

                if (_curblk==_blockmap.begin())
                    throw "b000ff: can't write before first block";

                _curblk--;
                uint32_t prevend= _curblk->second.endblkofs();
                int n= (_bpos-prevend)/_blocksize;
    
//              printf("alloccing b00 block: prev=%08x, next=%08x -> n=%d: ofs=%08x, size=%08x\n", 
//                      prevend, nextstart, n, prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                allocblock(prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                setpos(_bpos);
            }

            _curblk->second.modified= true;

            size_t want= std::min(n, _curblk->second.size-size_t(_bpos-_curblk->second.blockofs));

            _r->setpos(_curblk->second.block2file(_bpos));
            _r->write(p, want);

            _bpos += want;
            n -= want;
        }
    }